

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O0

void __thiscall
ot::commissioner::TokenManager::TokenManager(TokenManager *this,event_base *aEventBase)

{
  event_base *aEventBase_local;
  TokenManager *this_local;
  
  this->mSequenceNumber = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mSignedToken);
  std::__cxx11::string::string((string *)&this->mCommissionerId);
  std::__cxx11::string::string((string *)&this->mDomainName);
  coap::CoapSecure::CoapSecure(&this->mRegistrarClient,aEventBase,false);
  mbedtls_entropy_init((mbedtls_entropy_context *)&this->mEntropy);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&this->mCtrDrbg);
  mbedtls_ctr_drbg_seed
            ((mbedtls_ctr_drbg_context *)&this->mCtrDrbg,mbedtls_entropy_func,&this->mEntropy,
             (uchar *)0x0,0);
  mbedtls_pk_init((mbedtls_pk_context *)&this->mPublicKey);
  mbedtls_pk_init((mbedtls_pk_context *)&this->mPrivateKey);
  mbedtls_pk_init((mbedtls_pk_context *)&this->mDomainCAPublicKey);
  return;
}

Assistant:

TokenManager::TokenManager(struct event_base *aEventBase)
    : mRegistrarClient(aEventBase)
{
    mbedtls_entropy_init(&mEntropy);
    mbedtls_ctr_drbg_init(&mCtrDrbg);
    mbedtls_ctr_drbg_seed(&mCtrDrbg, mbedtls_entropy_func, &mEntropy, nullptr, 0);
    mbedtls_pk_init(&mPublicKey);
    mbedtls_pk_init(&mPrivateKey);
    mbedtls_pk_init(&mDomainCAPublicKey);
}